

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

uint * __thiscall
google::protobuf::RepeatedField<unsigned_int>::at(RepeatedField<unsigned_int> *this,int index)

{
  LogMessage *pLVar1;
  uint *puVar2;
  LogMessage local_a0;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x517);
    pLVar1 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar1);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x518);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_29,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  puVar2 = elements(this);
  return puVar2 + index;
}

Assistant:

inline const Element& RepeatedField<Element>::at(int index) const {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return elements()[index];
}